

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O2

void scheck_tempv(int n,float *tempv)

{
  float fVar1;
  ulong uVar2;
  char msg [256];
  char acStack_138 [264];
  
  if (n < 1) {
    n = 0;
  }
  uVar2 = 0;
  while( true ) {
    if ((uint)n == uVar2) {
      return;
    }
    fVar1 = tempv[uVar2];
    if ((fVar1 != 0.0) || (NAN(fVar1))) break;
    uVar2 = uVar2 + 1;
  }
  fprintf(_stderr,"tempv[%d] = %f\n",(double)fVar1,uVar2 & 0xffffffff);
  sprintf(acStack_138,"%s at line %d in file %s\n","scheck_tempv",0x15b,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sutil.c");
  superlu_abort_and_exit(acStack_138);
}

Assistant:

void scheck_tempv(int n, float *tempv)
{
    int i;
	
    for (i = 0; i < n; i++) {
	if (tempv[i] != 0.0) 
	{
	    fprintf(stderr,"tempv[%d] = %f\n", i,tempv[i]);
	    ABORT("scheck_tempv");
	}
    }
}